

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O3

bool exit_if_stop_char(Am_Input_Char ic)

{
  short in_DI;
  bool bVar1;
  Am_Input_Char local_4;
  
  bVar1 = ((uint)Am_Stop_Character & 0xffff) == 0x103;
  if (((bVar1 || in_DI != 0x103) && (!bVar1 || in_DI == 0x103)) &&
     (bVar1 = Am_Input_Char::helper_check_equal(&local_4,Am_Stop_Character), bVar1)) {
    Am_Main_Loop_Go = false;
    return true;
  }
  return false;
}

Assistant:

bool
exit_if_stop_char(Am_Input_Char ic)
{
  if (ic == Am_Stop_Character) {
    //   std::cerr << "Got stop event: exiting Amulet main loop." <<std::endl;
    Am_Main_Loop_Go = false;
    return true;
  } else
    return false;
}